

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O0

int __thiscall Pl_PNGFilter::PaethPredictor(Pl_PNGFilter *this,int a,int b,int c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int pc;
  int pb;
  int pa;
  int p;
  int c_local;
  int b_local;
  int a_local;
  Pl_PNGFilter *this_local;
  
  iVar1 = (a + b) - c;
  iVar2 = abs_diff(iVar1,a);
  iVar3 = abs_diff(iVar1,b);
  iVar1 = abs_diff(iVar1,c);
  if (((iVar3 < iVar2) || (this_local._4_4_ = a, iVar1 < iVar2)) &&
     (this_local._4_4_ = c, iVar3 <= iVar1)) {
    this_local._4_4_ = b;
  }
  return this_local._4_4_;
}

Assistant:

int
Pl_PNGFilter::PaethPredictor(int a, int b, int c)
{
    int p = a + b - c;
    int pa = abs_diff(p, a);
    int pb = abs_diff(p, b);
    int pc = abs_diff(p, c);

    if (pa <= pb && pa <= pc) {
        return a;
    }
    if (pb <= pc) {
        return b;
    }
    return c;
}